

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall
SquareMatrix_Inverse_Test::~SquareMatrix_Inverse_Test(SquareMatrix_Inverse_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SquareMatrix, Inverse) {
    auto equal = [](Float a, Float b, Float tol = 1e-4) {
        if (std::abs(a) < 1e-5 || std::abs(b) < 1e-5)
            return std::abs(a) - std::abs(b) < tol;
        return (std::abs(a) - std::abs(b)) / ((std::abs(a) + std::abs(b)) / 2) < tol;
    };

    int nFail = 0;
    int nIters = 1000;
    {
        constexpr int N = 2;
        for (int i = 0; i < nIters; ++i) {
            RNG rng(i);
            SquareMatrix<N> m = randomMatrix<N>(rng);
            pstd::optional<SquareMatrix<N>> inv = Inverse(m);
            if (!inv) {
                ++nFail;
                continue;
            }
            SquareMatrix<N> id = m * *inv;

            for (int j = 0; j < N; ++j)
                for (int k = 0; k < N; ++k) {
                    if (j == k)
                        EXPECT_TRUE(equal(id[j][k], 1))
                            << m << ", inv " << *inv << " prod " << id;
                    else
                        EXPECT_LT(std::abs(id[j][k]), 1e-4)
                            << m << ", inv " << *inv << " prod " << id;
                }
        }
    }
    {
        constexpr int N = 3;
        for (int i = 0; i < nIters; ++i) {
            RNG rng(i);
            SquareMatrix<N> m = randomMatrix<N>(rng);
            pstd::optional<SquareMatrix<N>> inv = Inverse(m);
            if (!inv) {
                ++nFail;
                continue;
            }
            SquareMatrix<N> id = m * *inv;

            for (int j = 0; j < N; ++j)
                for (int k = 0; k < N; ++k) {
                    if (j == k)
                        EXPECT_TRUE(equal(id[j][k], 1))
                            << m << ", inv " << *inv << " prod " << id;
                    else
                        EXPECT_LT(std::abs(id[j][k]), 1e-4)
                            << m << ", inv " << *inv << " prod " << id;
                }
        }
    }
    {
        constexpr int N = 4;
        for (int i = 0; i < nIters; ++i) {
            RNG rng(i);
            SquareMatrix<N> m = randomMatrix<N>(rng);
            pstd::optional<SquareMatrix<N>> inv = Inverse(m);
            if (!inv) {
                ++nFail;
                continue;
            }
            SquareMatrix<N> id = m * *inv;

            for (int j = 0; j < N; ++j)
                for (int k = 0; k < N; ++k) {
                    if (j == k)
                        EXPECT_TRUE(equal(id[j][k], 1))
                            << m << ", inv " << *inv << " prod " << id;
                    else
                        EXPECT_LT(std::abs(id[j][k]), 1e-4)
                            << m << ", inv " << *inv << " prod " << id;
                }
        }
    }

    EXPECT_LT(nFail, 3);
}